

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_Mesh::GetTightBoundingBox
          (ON_Mesh *this,ON_BoundingBox *Xtight_bbox,bool bGrowBox,
          ON_SimpleArray<ON_PlaneEquation> *Clip,ON_Xform *xform)

{
  __type __x;
  double dVar1;
  double dVar2;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  byte bVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  double *pdVar11;
  double *pdVar12;
  ON_PlaneEquation *pOVar13;
  ON_3fPoint *pOVar14;
  long lVar15;
  size_type __n;
  reference rVar16;
  bool local_5d9;
  byte local_57a;
  int local_518;
  int local_514;
  ON_3dPoint local_4e8;
  ON_3dPoint local_4d0;
  undefined1 local_4b8 [8];
  ON_3dPoint Pt_1;
  ON_3dPoint local_488;
  undefined1 local_470 [8];
  ON_3dPoint Pt;
  ON_Interval D_1;
  double cpnext_1;
  double cplast_1;
  ON_Interval D;
  double cpnext;
  double cplast;
  uint mask;
  int j_2;
  ON_Interval Dom;
  double local_398;
  double local_390;
  ON_3dPoint local_388;
  undefined1 auStack_370 [8];
  ON_3dPoint Next;
  ON_3dPoint Last;
  uint local_328;
  bool NextOut;
  int iStack_324;
  bool NextDataValid;
  uint NextData;
  int fvi;
  _Bit_type local_318;
  byte local_30e;
  byte local_30d;
  uint local_30c;
  bool LastOut;
  bool LastDataValid;
  ON_MeshFace *pOStack_308;
  uint LastData;
  ON_MeshFace *F;
  undefined1 auStack_2f8 [4];
  int fi;
  _Bit_type local_2f0;
  reference local_2e8;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  byte local_2b5;
  int local_2b4;
  undefined1 auStack_2b0 [3];
  bool out;
  int j_1;
  _Bit_type local_2a8;
  int local_29c;
  double dStack_298;
  int cdi1;
  double dStack_290;
  double local_288;
  int local_280;
  byte local_279;
  int cdi0;
  bool clipped;
  double local_270;
  double local_268;
  undefined1 auStack_260 [8];
  ON_3dPoint P;
  int vi;
  allocator<bool> local_232;
  bool local_231;
  undefined1 local_230 [8];
  vector<bool,_std::allocator<bool>_> ClipData;
  int bpv;
  int bits;
  int n;
  int vcnt;
  bool rc;
  int local_1d4;
  int local_1d0;
  int j;
  int i_1;
  bool AllIn;
  ON_3dPoint Corner [8];
  undefined1 local_100 [8];
  ON_BoundingBox bbox;
  ON_SHA1_Hash hash;
  uint i;
  ON_SHA1 sha1;
  ON_Xform *xform_local;
  ON_SimpleArray<ON_PlaneEquation> *Clip_local;
  bool bGrowBox_local;
  ON_BoundingBox *Xtight_bbox_local;
  ON_Mesh *this_local;
  
  Clip_local._7_1_ = bGrowBox;
  if ((bGrowBox) && (bVar5 = ON_BoundingBox::IsNotEmpty(Xtight_bbox), !bVar5)) {
    Clip_local._7_1_ = 0;
  }
  if ((Clip_local._7_1_ & 1) == 0) {
    memcpy(Xtight_bbox,&ON_BoundingBox::EmptyBoundingBox,0x30);
  }
  sha1.m_sha1_hash.m_digest._12_8_ = xform;
  if ((xform != (ON_Xform *)0x0) && (bVar5 = ON_Xform::IsIdentity(xform,0.0), bVar5)) {
    sha1.m_sha1_hash.m_digest[0xc] = '\0';
    sha1.m_sha1_hash.m_digest[0xd] = '\0';
    sha1.m_sha1_hash.m_digest[0xe] = '\0';
    sha1.m_sha1_hash.m_digest[0xf] = '\0';
    sha1.m_sha1_hash.m_digest[0x10] = '\0';
    sha1.m_sha1_hash.m_digest[0x11] = '\0';
    sha1.m_sha1_hash.m_digest[0x12] = '\0';
    sha1.m_sha1_hash.m_digest[0x13] = '\0';
  }
  iVar8 = ON_SimpleArray<ON_PlaneEquation>::Count(Clip);
  if ((iVar8 < 1) && (sha1.m_sha1_hash.m_digest._12_8_ == 0)) {
    pdVar11 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_min);
    pdVar12 = ON_3dPoint::operator_cast_to_double_(&Xtight_bbox->m_max);
    iVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                      (this,pdVar11,pdVar12,(ulong)(Clip_local._7_1_ & 1));
    this_local._7_1_ = (bool)(-(char)iVar8 & 1);
  }
  else {
    ON_SHA1::ON_SHA1((ON_SHA1 *)(hash.m_digest + 0x10));
    if (sha1.m_sha1_hash.m_digest._12_8_ != 0) {
      ON_SHA1::AccumulateTransformation
                ((ON_SHA1 *)(hash.m_digest + 0x10),(ON_Xform *)sha1.m_sha1_hash.m_digest._12_8_);
    }
    hash.m_digest[0xc] = '\0';
    hash.m_digest[0xd] = '\0';
    hash.m_digest[0xe] = '\0';
    hash.m_digest[0xf] = '\0';
    for (; uVar4 = hash.m_digest._12_4_,
        uVar9 = ON_SimpleArray<ON_PlaneEquation>::UnsignedCount(Clip), (uint)uVar4 < uVar9;
        hash.m_digest._12_4_ = hash.m_digest._12_4_ + 1) {
      pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,hash.m_digest._12_4_);
      ON_SHA1::AccumulateDoubleArray((ON_SHA1 *)(hash.m_digest + 0x10),4,&pOVar13->x);
    }
    ON_SHA1::Hash((ON_SHA1_Hash *)&bbox.m_max.z,(ON_SHA1 *)(hash.m_digest + 0x10));
    ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_100);
    bVar5 = ON_BoundingBoxCache::GetBoundingBox
                      (&this->m_tight_bbox_cache,(ON_SHA1_Hash *)&bbox.m_max.z,
                       (ON_BoundingBox *)local_100);
    if (bVar5) {
      if ((Clip_local._7_1_ & 1) == 0) {
        memcpy(Xtight_bbox,local_100,0x30);
      }
      else {
        ON_BoundingBox::Union(Xtight_bbox,(ON_BoundingBox *)local_100);
      }
      this_local._7_1_ = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
    }
    else {
      if ((sha1.m_sha1_hash.m_digest._12_8_ == 0) &&
         (bVar5 = ON_BoundingBox::IsNotEmpty(&this->m_vertex_bbox), bVar5)) {
        ON_BoundingBox::GetCorners(&this->m_vertex_bbox,(ON_3dPoint *)&i_1);
        bVar5 = true;
        for (local_1d0 = 0; bVar5 && local_1d0 < 8; local_1d0 = local_1d0 + 1) {
          local_1d4 = 0;
          while( true ) {
            bVar6 = false;
            if (bVar5) {
              iVar8 = ON_SimpleArray<ON_PlaneEquation>::Count(Clip);
              bVar6 = local_1d4 < iVar8;
            }
            if (!bVar6) break;
            pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,local_1d4);
            lVar15 = (long)local_1d0;
            P_00.y = Corner[lVar15].x;
            P_00.x = (double)*(undefined8 *)(&i_1 + lVar15 * 6);
            P_00.z = Corner[lVar15].y;
            dVar1 = ON_PlaneEquation::ValueAt(pOVar13,P_00);
            bVar5 = dVar1 <= 0.0;
            local_1d4 = local_1d4 + 1;
          }
        }
        if (bVar5) {
          pdVar11 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)local_100);
          pdVar12 = ON_3dPoint::operator_cast_to_double_((ON_3dPoint *)&bbox.m_min.z);
          iVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                            (this,pdVar11,pdVar12,0);
          ON_BoundingBoxCache::AddBoundingBox
                    (&this->m_tight_bbox_cache,(ON_BoundingBox *)local_100,
                     (ON_SHA1_Hash *)&bbox.m_max.z);
          if (((-(char)iVar8 & 1U) == 0) || ((Clip_local._7_1_ & 1) == 0)) {
            memcpy(Xtight_bbox,local_100,0x30);
          }
          else {
            ON_BoundingBox::Union(Xtight_bbox,(ON_BoundingBox *)local_100);
          }
          bVar5 = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
          return bVar5;
        }
      }
      iVar8 = VertexCount(this);
      if (iVar8 < 3) {
        this_local._7_1_ = false;
      }
      else {
        bpv = ON_SimpleArray<ON_PlaneEquation>::Count(Clip);
        if (0x20 < bpv) {
          bpv = 0x20;
        }
        if (bpv < 2) {
          local_514 = bpv;
        }
        else {
          local_514 = bpv + 1;
        }
        if (bpv < 1) {
          local_518 = 1;
        }
        else {
          __x = std::log2<int>(local_514);
          dVar1 = ceil(__x);
          local_518 = 1 << ((byte)(int)dVar1 & 0x1f);
        }
        ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._4_4_ = local_518;
        local_231 = false;
        std::allocator<bool>::allocator(&local_232);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_230,(long)(iVar8 * local_518),
                   &local_231,&local_232);
        std::allocator<bool>::~allocator(&local_232);
        for (P.z._0_4_ = 0; P.z._0_4_ < iVar8; P.z._0_4_ = P.z._0_4_ + 1) {
          pOVar14 = ON_SimpleArray<ON_3fPoint>::operator[]
                              (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,P.z._0_4_);
          ON_3dPoint::ON_3dPoint((ON_3dPoint *)auStack_260,pOVar14);
          if (sha1.m_sha1_hash.m_digest._12_8_ != 0) {
            ON_Xform::operator*((ON_3dPoint *)&cdi0,(ON_Xform *)sha1.m_sha1_hash.m_digest._12_8_,
                                (ON_3dPoint *)auStack_260);
            auStack_260 = (undefined1  [8])_cdi0;
            P.x = local_270;
            P.y = local_268;
          }
          local_279 = 0;
          if (0 < bpv) {
            local_280 = P.z._0_4_ *
                        ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage._4_4_;
            pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,0);
            local_288 = P.y;
            dStack_298 = (double)auStack_260;
            dStack_290 = P.x;
            P_01.y = P.x;
            P_01.x = (double)auStack_260;
            P_01.z = P.y;
            dVar1 = ON_PlaneEquation::ValueAt(pOVar13,P_01);
            bVar5 = 0.0 < dVar1;
            local_279 = bVar5;
            if (1 < bpv) {
              local_29c = local_280 + 2;
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_230,
                                  (long)(local_280 + 1));
              _auStack_2b0 = rVar16;
              std::_Bit_reference::operator=((_Bit_reference *)auStack_2b0,bVar5);
              for (local_2b4 = 1; local_2b4 < bpv; local_2b4 = local_2b4 + 1) {
                pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,local_2b4);
                local_2c8 = P.y;
                local_2d8 = (double)auStack_260;
                dStack_2d0 = P.x;
                P_02.y = P.x;
                P_02.x = (double)auStack_260;
                P_02.z = P.y;
                dVar1 = ON_PlaneEquation::ValueAt(pOVar13,P_02);
                __n = (size_type)local_29c;
                local_29c = local_29c + 1;
                local_2b5 = 0.0 < dVar1;
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)local_230,__n);
                local_2e8 = rVar16;
                std::_Bit_reference::operator=(&local_2e8,0.0 < dVar1);
                local_57a = 1;
                if ((local_279 & 1) == 0) {
                  local_57a = local_2b5;
                }
                local_279 = local_57a & 1;
              }
            }
            bVar3 = local_279;
            rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_230,(long)local_280);
            _auStack_2f8 = rVar16;
            std::_Bit_reference::operator=((_Bit_reference *)auStack_2f8,(bool)(bVar3 & 1));
          }
          if ((local_279 & 1) == 0) {
            ON_BoundingBox::Set((ON_BoundingBox *)local_100,(ON_3dPoint *)auStack_260,1);
          }
        }
        if (0 < bpv) {
          F._4_4_ = 0;
          while( true ) {
            iVar8 = F._4_4_;
            iVar10 = FaceCount(this);
            if (iVar10 <= iVar8) break;
            pOStack_308 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,F._4_4_);
            local_30c = 0;
            local_30d = 0;
            rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_230,
                                (long)(pOStack_308->vi[0] *
                                      ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage._4_4_));
            _NextData = rVar16;
            local_30e = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&NextData);
            if ((bool)local_30e) {
              GetClipData(pOStack_308->vi[0],(vector<bool,_std::allocator<bool>_> *)local_230,
                          &local_30c,bpv,
                          ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage._4_4_);
              local_30d = 1;
            }
            for (iStack_324 = 0; iStack_324 < 4; iStack_324 = iStack_324 + 1) {
              if ((iStack_324 != 2) || (pOStack_308->vi[2] != pOStack_308->vi[3])) {
                local_328 = 0;
                bVar5 = false;
                uVar9 = iStack_324 + 1U;
                if ((int)(iStack_324 + 1U) < 0) {
                  uVar9 = iStack_324 + 4;
                }
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)local_230,
                                    (long)(pOStack_308->vi
                                           [(int)((iStack_324 + 1) - (uVar9 & 0xfffffffc))] *
                                          ClipData.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_end_of_storage._4_4_))
                ;
                Last.z = (double)rVar16._M_p;
                bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&Last.z);
                if (bVar6) {
                  uVar9 = iStack_324 + 1U;
                  if ((int)(iStack_324 + 1U) < 0) {
                    uVar9 = iStack_324 + 4;
                  }
                  GetClipData(pOStack_308->vi[(int)((iStack_324 + 1) - (uVar9 & 0xfffffffc))],
                              (vector<bool,_std::allocator<bool>_> *)local_230,&local_328,bpv,
                              ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage._4_4_);
                  bVar5 = true;
                }
                if (((local_30e & 1) != 0) || (bVar6)) {
                  if ((local_30d & 1) == 0) {
                    GetClipData(pOStack_308->vi[iStack_324],
                                (vector<bool,_std::allocator<bool>_> *)local_230,&local_30c,bpv,
                                ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage._4_4_);
                    local_30d = 1;
                  }
                  if (!bVar5) {
                    GetClipData(pOStack_308->vi[iStack_324],
                                (vector<bool,_std::allocator<bool>_> *)local_230,&local_328,bpv,
                                ClipData.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage._4_4_);
                    bVar5 = true;
                  }
                }
                if ((((local_30e & 1) != 0) || (bVar6)) && ((local_30c & local_328) == 0)) {
                  pOVar14 = ON_SimpleArray<ON_3fPoint>::operator[]
                                      (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,
                                       pOStack_308->vi[iStack_324]);
                  ON_3dPoint::ON_3dPoint((ON_3dPoint *)&Next.z,pOVar14);
                  uVar9 = iStack_324 + 1U;
                  if ((int)(iStack_324 + 1U) < 0) {
                    uVar9 = iStack_324 + 4;
                  }
                  pOVar14 = ON_SimpleArray<ON_3fPoint>::operator[]
                                      (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,
                                       pOStack_308->vi
                                       [(int)((iStack_324 + 1) - (uVar9 & 0xfffffffc))]);
                  ON_3dPoint::ON_3dPoint((ON_3dPoint *)auStack_370,pOVar14);
                  if (sha1.m_sha1_hash.m_digest._12_8_ != 0) {
                    ON_Xform::operator*(&local_388,(ON_Xform *)sha1.m_sha1_hash.m_digest._12_8_,
                                        (ON_3dPoint *)&Next.z);
                    Last.y = local_388.z;
                    Next.z = local_388.x;
                    Last.x = local_388.y;
                    ON_Xform::operator*((ON_3dPoint *)(Dom.m_t + 1),
                                        (ON_Xform *)sha1.m_sha1_hash.m_digest._12_8_,
                                        (ON_3dPoint *)auStack_370);
                    auStack_370 = (undefined1  [8])Dom.m_t[1];
                    Next.x = local_398;
                    Next.y = local_390;
                  }
                  ON_Interval::ON_Interval((ON_Interval *)&mask,0.0,1.0);
                  cplast._4_4_ = 0;
                  while( true ) {
                    local_5d9 = false;
                    if (cplast._4_4_ < bpv) {
                      local_5d9 = ON_Interval::operator!=
                                            ((ON_Interval *)&mask,&ON_Interval::EmptyInterval);
                    }
                    if (local_5d9 == false) break;
                    uVar9 = 1 << (((char)bpv + -1) - (char)cplast._4_4_ & 0x1fU);
                    if ((uVar9 & local_30c) == 0) {
                      if ((uVar9 & local_328) != 0) {
                        pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,cplast._4_4_);
                        P_05.y = Last.x;
                        P_05.x = Next.z;
                        P_05.z = Last.y;
                        dVar1 = ON_PlaneEquation::ValueAt(pOVar13,P_05);
                        pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,cplast._4_4_);
                        P_06.y = Next.x;
                        P_06.x = (double)auStack_370;
                        P_06.z = Next.y;
                        dVar2 = ON_PlaneEquation::ValueAt(pOVar13,P_06);
                        ON_Interval::ON_Interval((ON_Interval *)&Pt.z,0.0,-dVar1 / (dVar2 - dVar1));
                        ON_Interval::Intersection((ON_Interval *)&mask,(ON_Interval *)&Pt.z);
                      }
                    }
                    else {
                      pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,cplast._4_4_);
                      P_03.y = Last.x;
                      P_03.x = Next.z;
                      P_03.z = Last.y;
                      dVar1 = ON_PlaneEquation::ValueAt(pOVar13,P_03);
                      pOVar13 = ON_SimpleArray<ON_PlaneEquation>::operator[](Clip,cplast._4_4_);
                      D.m_t[1] = (double)auStack_370;
                      P_04.y = Next.x;
                      P_04.x = (double)auStack_370;
                      P_04.z = Next.y;
                      dVar2 = ON_PlaneEquation::ValueAt(pOVar13,P_04);
                      ON_Interval::ON_Interval((ON_Interval *)&cplast_1,dVar1 / (dVar1 - dVar2),1.0)
                      ;
                      ON_Interval::Intersection((ON_Interval *)&mask,(ON_Interval *)&cplast_1);
                    }
                    cplast._4_4_ = cplast._4_4_ + 1;
                  }
                  bVar7 = ON_Interval::operator!=((ON_Interval *)&mask,&ON_Interval::EmptyInterval);
                  if (bVar7) {
                    pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,0);
                    if (0.0 < *pdVar11) {
                      pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,0);
                      ::operator*(&local_488,1.0 - *pdVar11,(ON_3dPoint *)&Next.z);
                      pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,0);
                      ::operator*((ON_3dPoint *)&Pt_1.z,*pdVar11,(ON_3dPoint *)auStack_370);
                      ON_3dPoint::operator+
                                ((ON_3dPoint *)local_470,&local_488,(ON_3dPoint *)&Pt_1.z);
                      ON_BoundingBox::Set((ON_BoundingBox *)local_100,(ON_3dPoint *)local_470,1);
                    }
                    pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,1);
                    if (*pdVar11 <= 1.0 && *pdVar11 != 1.0) {
                      pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,1);
                      ::operator*(&local_4d0,1.0 - *pdVar11,(ON_3dPoint *)&Next.z);
                      pdVar11 = ON_Interval::operator[]((ON_Interval *)&mask,1);
                      ::operator*(&local_4e8,*pdVar11,(ON_3dPoint *)auStack_370);
                      ON_3dPoint::operator+((ON_3dPoint *)local_4b8,&local_4d0,&local_4e8);
                      ON_BoundingBox::Set((ON_BoundingBox *)local_100,(ON_3dPoint *)local_4b8,1);
                    }
                  }
                }
                local_30c = local_328;
                local_30e = bVar6;
                local_30d = bVar5;
              }
            }
            F._4_4_ = F._4_4_ + 1;
          }
        }
        ON_BoundingBoxCache::AddBoundingBox
                  (&this->m_tight_bbox_cache,(ON_BoundingBox *)local_100,
                   (ON_SHA1_Hash *)&bbox.m_max.z);
        bVar5 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)local_100);
        if (bVar5) {
          if ((Clip_local._7_1_ & 1) == 0) {
            memcpy(Xtight_bbox,local_100,0x30);
          }
          else {
            ON_BoundingBox::Union(Xtight_bbox,(ON_BoundingBox *)local_100);
          }
        }
        this_local._7_1_ = ON_BoundingBox::IsNotEmpty(Xtight_bbox);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)local_230);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Mesh::GetTightBoundingBox(
	ON_BoundingBox& Xtight_bbox,
	bool bGrowBox,
	const ON_SimpleArray<ON_PlaneEquation>& Clip,
	const ON_Xform* xform
) const
{
	if (bGrowBox && false == Xtight_bbox.IsNotEmpty() )
		bGrowBox = false;

	if (!bGrowBox)
		Xtight_bbox = ON_BoundingBox::EmptyBoundingBox;

	// Avoid applying the identity transformation repeatedly
	if (xform && xform->IsIdentity())
		xform = nullptr;

  if (Clip.Count() <= 0 && xform == nullptr)
    return (GetBBox(Xtight_bbox.m_min, Xtight_bbox.m_max, bGrowBox) ? true : false);

  // Dale Lear
  // Set hash = sha1 hash of information needed to get the tight bounding box.
  // This does not include a hash of mesh vertex locations. These cached
  // boxes are removed by ON_Mesh.InvalidateBoundingBoxes() so this hash
  // does not need to include vertex locations or face information.
  ON_SHA1 sha1;
  if (nullptr != xform)
    sha1.AccumulateTransformation(*xform);
  for (unsigned int i = 0; i < Clip.UnsignedCount(); i++)
  {
    sha1.AccumulateDoubleArray(4, &Clip[i].x);
  }
  const ON_SHA1_Hash hash = sha1.Hash();

  ON_BoundingBox bbox;

  if (m_tight_bbox_cache.GetBoundingBox(hash, bbox))
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
    return Xtight_bbox.IsNotEmpty();
  }

	// Perform clip test on cached bbox 
	if (xform == nullptr && m_vertex_bbox.IsNotEmpty())
	{
		ON_3dPoint Corner[8];
		m_vertex_bbox.GetCorners(Corner);

		bool AllIn = true;
		for( int i=0; AllIn && i<8; i++)
			for (int j = 0; AllIn && j < Clip.Count(); j++)
			{
				AllIn = (Clip[j].ValueAt(Corner[i]) <= 0.0);
			}

    if (AllIn)
    {
      bool rc = GetBBox(bbox.m_min, bbox.m_max, false) ? true : false;
      m_tight_bbox_cache.AddBoundingBox(bbox, hash);
      if (rc && bGrowBox)
        Xtight_bbox.Union(bbox);
      else
        Xtight_bbox = bbox;
      return Xtight_bbox.IsNotEmpty();
    }
	}

	// Now just add verticies of the clipped mesh
	int vcnt = VertexCount();

  // 16 Sept 2021, Mikko, RH-49510:
  // Bail out if the mesh is bogus. In the associated youtrack item
  // this fixes the bounding box of a block being way too big.
  if (vcnt < 3)
    return false;
	
	// n = number of clipping planes.  At most 32 clipping planes are allowed so that this function can use unsigned int
	// to represent the 32 clip predicates.
	int n = Clip.Count();
	if (n > 32)
		n = 32;
	int bits = (n > 1) ? n + 1 : n;
	int bpv = (n>0)?1<<int(ceil(log2(bits))) : 1;		// bits per vertex this is a power of 2
	std::vector<bool> ClipData(vcnt*bpv, false);  // ClipData[ vi*bpv ] is true if vertex vi is clipped out of the view
                                         // If n>1 then further information is provided by
																				//    ClipData[vi*bpv + j+ 1] is true if Clip[j](m_V[vi])>0 that is
																				//           vertex vi is clipped out by Clip[j]
	// Compute ClipData for each vertex
	for (int vi = 0; vi < vcnt; vi++)
	{
		ON_3dPoint P = m_V[vi];
		if (xform)
			P = (*xform)*P;

		bool clipped = false;
		if (n > 0)
		{
			int cdi0 = vi*bpv;
			clipped = Clip[0].ValueAt(P) > 0;

			if (n > 1)
			{
				int cdi1 = cdi0 + 1;
				ClipData[cdi1++] = clipped;
				for (int j = 1; j < n; j++)
				{
					bool out = Clip[j].ValueAt(P) > 0;
					ClipData[cdi1++] = out;
					clipped = clipped || out;
				}
			}
			ClipData[cdi0] = clipped;
		}
		// If the vertex is not clipped add it to the boundingbox
		if( !clipped)
			bbox.Set(P, true);
	}

	if (n > 0)
	{
		// Now process each mesh face and look for intersections with the clipping region boundary
		for (int fi = 0; fi < FaceCount(); fi++)
		{
			const ON_MeshFace& F = m_F[fi];
			unsigned int LastData=0;
			bool LastDataValid = false;
			bool LastOut = ClipData[F.vi[0] * bpv];
			if (LastOut)
			{
				GetClipData(F.vi[0], ClipData, &LastData, n, bpv);
				LastDataValid = true;
			}
			for (int fvi = 0; fvi < 4; fvi++)
			{
				if (fvi == 2 && F.vi[fvi] == F.vi[fvi + 1])
					continue;

				unsigned int NextData=0;
				bool NextDataValid=false;
				bool NextOut = ClipData[F.vi[(fvi + 1) % 4] * bpv];
				if (NextOut)
				{
					GetClipData(F.vi[(fvi + 1) % 4], ClipData, &NextData, n, bpv);
					NextDataValid = true;
				}

				if (LastOut || NextOut)
				{
					// Make sure *Data is Valid
					if (!LastDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &LastData, n, bpv);
						LastDataValid = true;
					}
					if (!NextDataValid)
					{
						GetClipData(F.vi[fvi], ClipData, &NextData, n, bpv);
						NextDataValid = true;
					}
				}
				if ((LastOut || NextOut) && (LastData & NextData) == 0)
				{
					// Is there a segment of this edge that is not clipped out
					ON_3dPoint Last = m_V[F.vi[fvi]];
					ON_3dPoint Next = m_V[F.vi[(fvi + 1) % 4]];
					if (xform)
					{
						Last = (*xform)*Last;
						Next = (*xform)*Next;
					}

					ON_Interval Dom(0.0, 1.0);  // Dom parameterizes the line segment from Last to Next
					for (int j = 0; j < n && Dom != ON_Interval::EmptyInterval; j++)
					{
						unsigned int mask = 1 << (n - 1 - j);
						if (mask & LastData)
						{
							double cplast = Clip[j].ValueAt(Last);		// out >0
							double cpnext = Clip[j].ValueAt(Next);		// in <0 
							ON_Interval D(cplast / (cplast - cpnext), 1.0);
							Dom.Intersection(D);
						}
						else if (mask & NextData)
						{
							double cplast = Clip[j].ValueAt(Last);
							double cpnext = Clip[j].ValueAt(Next);
							ON_Interval D(0.0, -cplast / (cpnext - cplast));
							Dom.Intersection(D);
						}
					}
					if (Dom != ON_Interval::EmptyInterval)
					{
						if (Dom[0] > 0.0)
						{
							ON_3dPoint Pt = (1 - Dom[0])*Last + Dom[0] * Next;
							bbox.Set(Pt, true);
						}
						if (Dom[1] < 1.0)
						{
							ON_3dPoint Pt = (1 - Dom[1])*Last + Dom[1] * Next;
							bbox.Set(Pt, true);
						}
					}
				}

				LastOut = NextOut;
				LastDataValid = NextDataValid;
				LastData = NextData;
			}
		}
	}

  m_tight_bbox_cache.AddBoundingBox(bbox, hash);
  if (bbox.IsNotEmpty())
  {
    if (bGrowBox)
      Xtight_bbox.Union(bbox);
    else
      Xtight_bbox = bbox;
  }

  return Xtight_bbox.IsNotEmpty();
}